

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * stmtSequence(void)

{
  StmtKind SVar1;
  treeNode *ptVar2;
  bool local_55;
  allocator local_41;
  string local_40;
  treeNode *local_20;
  treeNode *pre;
  treeNode *p;
  treeNode *ret;
  
  p = (treeNode *)0x0;
  pre = (treeNode *)0x0;
  local_20 = (treeNode *)0x0;
  while( true ) {
    local_55 = false;
    if (nextToken.kind != Eof) {
      local_55 = std::operator!=(&nextToken.text,"}");
    }
    if (local_55 == false) break;
    pre = statement();
    if (pre != (treeNode *)0x0) {
      ptVar2 = pre;
      if (local_20 != (treeNode *)0x0) {
        local_20->sibling = pre;
        ptVar2 = p;
      }
      p = ptVar2;
      SVar1 = (pre->kind).stmtKind;
      local_20 = pre;
      if ((SVar1 == doRpt) || (SVar1 - assignStmt < 5 || SVar1 == breakStmt)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_40,";",&local_41);
        match(&local_40,lackSem);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
    }
  }
  return p;
}

Assistant:

treeNode* stmtSequence()
{
    treeNode* ret=nullptr;
    treeNode* p=nullptr;
    treeNode* pre=nullptr;
    while(nextToken.kind!=Token::Eof&&nextToken.text!="}")
    {
        p=statement();
        if(p!=nullptr)
        {
            if(pre!=nullptr)pre->sibling=p;else ret=p;
            pre=p;
            switch(pre->kind.stmtKind)
            {
                case StmtKind::assignStmt:
                case StmtKind::breakStmt:
                case StmtKind::continueStmt:
                case StmtKind::doRpt:
                case StmtKind::printStmt:
                case StmtKind::readStmt:
                case StmtKind::declareStmt:
                    match(";",Error::lackSem);
                    break;
            }
        }
    }
    //match(";",Error::lackSem);
    return ret;
}